

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall nv::Kernel2::initBlendedSobel(Kernel2 *this,Vector4 *scale)

{
  float fVar1;
  int iVar2;
  scalar sVar3;
  int local_2e0;
  int local_2dc;
  int e_2;
  int i_3;
  float elements_3 [9];
  int local_2ac;
  int e_1;
  int i_2;
  float elements_2 [25];
  int local_23c;
  int e;
  int i_1;
  float elements_1 [49];
  int local_16c;
  float local_168;
  int i;
  float elements [81];
  Vector4 *scale_local;
  Kernel2 *this_local;
  
  if ((this->m_windowSize != 9) &&
     (iVar2 = nvAbort("m_windowSize == 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/Filter.cpp"
                      ,0x1da,"void nv::Kernel2::initBlendedSobel(const Vector4 &)"), iVar2 == 1)) {
    raise(5);
  }
  memcpy(&local_168,&DAT_002e8930,0x144);
  for (local_16c = 0; local_16c < 0x51; local_16c = local_16c + 1) {
    fVar1 = (&local_168)[local_16c];
    sVar3 = Vector4::w(scale);
    this->m_data[local_16c] = fVar1 * sVar3;
  }
  memcpy(&e,&DAT_002e8a80,0xc4);
  for (local_23c = 0; local_23c < 7; local_23c = local_23c + 1) {
    for (elements_2[0x18] = 0.0; (int)elements_2[0x18] < 7;
        elements_2[0x18] = (float)((int)elements_2[0x18] + 1)) {
      fVar1 = (float)(&e)[local_23c * 7 + (int)elements_2[0x18]];
      sVar3 = Vector4::z(scale);
      iVar2 = (local_23c + 1) * 9 + (int)elements_2[0x18] + 1;
      this->m_data[iVar2] = fVar1 * sVar3 + this->m_data[iVar2];
    }
  }
  memcpy(&e_1,&DAT_002e8b50,100);
  for (local_2ac = 0; local_2ac < 5; local_2ac = local_2ac + 1) {
    for (elements_3[8] = 0.0; (int)elements_3[8] < 5;
        elements_3[8] = (float)((int)elements_3[8] + 1)) {
      fVar1 = (float)(&e_1)[local_2ac * 5 + (int)elements_3[8]];
      sVar3 = Vector4::y(scale);
      iVar2 = (local_2ac + 2) * 9 + (int)elements_3[8] + 2;
      this->m_data[iVar2] = fVar1 * sVar3 + this->m_data[iVar2];
    }
  }
  memset(&e_2,0,0x24);
  e_2 = -0x40800000;
  elements_3[0] = 1.0;
  elements_3[1] = -2.0;
  elements_3[3] = 2.0;
  elements_3[4] = -1.0;
  elements_3[6] = 1.0;
  for (local_2dc = 0; local_2dc < 3; local_2dc = local_2dc + 1) {
    for (local_2e0 = 0; local_2e0 < 3; local_2e0 = local_2e0 + 1) {
      fVar1 = (float)(&e_2)[local_2dc * 3 + local_2e0];
      sVar3 = Vector4::x(scale);
      iVar2 = (local_2dc + 3) * 9 + local_2e0 + 3;
      this->m_data[iVar2] = fVar1 * sVar3 + this->m_data[iVar2];
    }
  }
  return;
}

Assistant:

void Kernel2::initBlendedSobel(const Vector4 & scale)
{
	nvCheck(m_windowSize == 9);

	{
		const float elements[] = {
            -1, -2, -3, -4, 0, 4, 3, 2, 1,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -5, -6, -7, -8, 0, 8, 7, 6, 5,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -1, -2, -3, -4, 0, 4, 3, 2, 1
		};
		
		for (int i = 0; i < 9*9; i++) {
			m_data[i] = elements[i] * scale.w();
		}
	}
	{
		const float elements[] = {
            -1, -2, -3, 0, 3, 2, 1,
            -2, -3, -4, 0, 4, 3, 2,
            -3, -4, -5, 0, 5, 4, 3,
            -4, -5, -6, 0, 6, 5, 4,
            -3, -4, -5, 0, 5, 4, 3,
            -2, -3, -4, 0, 4, 3, 2,
            -1, -2, -3, 0, 3, 2, 1,
		};

		for (int i = 0; i < 7; i++) {
			for (int e = 0; e < 7; e++) {
				m_data[(i + 1) * 9 + e + 1] += elements[i * 7 + e] * scale.z();
			}
		}
	}
	{
		const float elements[] = {
            -1, -2, 0, 2, 1,
            -2, -3, 0, 3, 2,
            -3, -4, 0, 4, 3,
            -2, -3, 0, 3, 2,
            -1, -2, 0, 2, 1
		};

		for (int i = 0; i < 5; i++) {
			for (int e = 0; e < 5; e++) {
				m_data[(i + 2) * 9 + e + 2] += elements[i * 5 + e] * scale.y();
			}
		}
	}
	{
		const float elements[] = {
            -1, 0, 1,
            -2, 0, 2,
            -1, 0, 1,
		};

		for (int i = 0; i < 3; i++) {
			for (int e = 0; e < 3; e++) {
				m_data[(i + 3) * 9 + e + 3] += elements[i * 3 + e] * scale.x();
			}
		}
	}
}